

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

bool __thiscall
(anonymous_namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer::
handleChild(wasm::Expression*&,wasm::Expression__unsigned_int_
          (void *this,Expression **child,Expression *parent,Index fieldIndex)

{
  undefined8 *puVar1;
  uintptr_t uVar2;
  Module *module;
  unique_ptr *puVar3;
  char *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  size_type sVar8;
  undefined1 *puVar9;
  long lVar10;
  Block *pBVar11;
  Expression *item;
  HeapType HVar12;
  Expression *pEVar13;
  undefined4 in_register_0000000c;
  undefined8 uVar14;
  ulong uVar15;
  MixedArena *pMVar16;
  long lVar17;
  IString IVar18;
  Name NVar19;
  optional<wasm::Type> type;
  Name NVar20;
  Type local_a8 [2];
  Builder local_98;
  Builder builder;
  Expression local_68;
  long local_58;
  long local_48;
  Const *local_40;
  Function *local_38;
  
  uVar14 = CONCAT44(in_register_0000000c,fieldIndex);
  pEVar13 = *child;
  if (((pEVar13 != (Expression *)0x0) && (pEVar13->_id == GlobalGetId)) &&
     (sVar8 = std::
              _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::count(*(_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        **)((long)this + 0xe8),(key_type *)(pEVar13 + 1)), sVar8 == 0)) {
    local_40 = (Const *)CONCAT44(local_40._4_4_,fieldIndex);
    bVar7 = anon_unknown.dwarf_5f52c::isNullableAndMutable
                      ((Expression *)(parent->type).id,fieldIndex);
    if (bVar7) {
      lVar17 = *(long *)((long)this + 0xd8);
      puVar1 = (undefined8 *)**(long **)((long)this + 0xe0);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      uVar2 = puVar1[7];
      local_a8[0].id = uVar2;
      local_48 = lVar17;
      if (*(char *)(lVar17 + 0x108) == '\0') {
        local_98.wasm = *(Module **)(lVar17 + 8);
        pMVar16 = &(local_98.wasm)->allocator;
        puVar9 = (undefined1 *)MixedArena::allocSpace(pMVar16,0x40,8);
        uVar15 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
        *puVar9 = 1;
        *(undefined8 *)(puVar9 + 8) = 0;
        *(undefined8 *)(puVar9 + 0x10) = 0;
        *(undefined8 *)(puVar9 + 0x18) = 0;
        *(undefined8 *)(puVar9 + 0x20) = 0;
        *(undefined8 *)(puVar9 + 0x28) = 0;
        *(undefined8 *)(puVar9 + 0x30) = 0;
        *(MixedArena **)(puVar9 + 0x38) = pMVar16;
        *(undefined1 **)(lVar17 + 0x100) = puVar9;
        *(undefined1 *)(lVar17 + 0x108) = 1;
        module = *(Module **)(lVar17 + 8);
        if ((module->start).super_IString.str._M_str == (char *)0x0) {
          NVar20.super_IString.str = (IString)wasm::IString::interned(5,"start",0);
          IVar18.str = (string_view)wasm::Names::getValidFunctionName(module,NVar20);
          ((IString *)(*(long *)(lVar17 + 8) + 0xc0))->str = IVar18.str;
          puVar3 = *(unique_ptr **)(lVar17 + 8);
          pcVar4 = *(char **)(puVar3 + 0xc0);
          HVar12.id = *(uintptr_t *)(puVar3 + 200);
          wasm::HeapType::HeapType((HeapType *)&builder,(Signature)ZEXT816(0));
          local_68._0_8_ = (Module *)0x0;
          local_68.type.id = 0;
          local_58 = 0;
          NVar20.super_IString.str._M_str = pcVar4;
          NVar20.super_IString.str._M_len = (size_t)&local_38;
          wasm::Builder::makeFunction
                    (NVar20,HVar12,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)builder.wasm,
                     &local_68);
          wasm::Module::addFunction(puVar3);
          lVar17 = local_48;
          if (local_38 != (Function *)0x0) {
            std::default_delete<wasm::Function>::operator()
                      ((default_delete<wasm::Function> *)&local_38,local_38);
          }
          local_38 = (Function *)0x0;
          if ((Module *)local_68._0_8_ != (Module *)0x0) {
            operator_delete((void *)local_68._0_8_,local_58 - local_68._0_8_);
          }
        }
        else {
          NVar19.super_IString.str._M_str = (char *)(module->start).super_IString.str._M_len;
          NVar19.super_IString.str._M_len = (size_t)module;
          lVar10 = wasm::Module::getFunction(NVar19);
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._8_8_ = 0;
          type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar15;
          pBVar11 = wasm::Builder::makeSequence
                              (&local_98,*(Expression **)(lVar17 + 0x100),
                               *(Expression **)(lVar10 + 0x60),type);
          *(Block **)(lVar10 + 0x60) = pBVar11;
        }
      }
      local_68._0_8_ = *(long *)(lVar17 + 8);
      pMVar16 = &((Module *)local_68._0_8_)->allocator;
      puVar9 = (undefined1 *)MixedArena::allocSpace(pMVar16,0x20,8);
      *puVar9 = 10;
      *(undefined8 *)(puVar9 + 0x10) = uVar5;
      *(undefined8 *)(puVar9 + 0x18) = uVar6;
      *(uintptr_t *)(puVar9 + 8) = uVar2;
      bVar7 = wasm::Type::isStruct(local_a8);
      if (bVar7) {
        item = (Expression *)MixedArena::allocSpace(pMVar16,0x30,8);
        item->_id = StructSetId;
        (item->type).id = 0;
        *(int *)(item + 1) = (int)local_40;
        item[1].type.id = (uintptr_t)puVar9;
        *(Expression **)(item + 2) = pEVar13;
        *(undefined4 *)&item[2].type.id = 0;
        wasm::StructSet::finalize();
      }
      else {
        local_40 = wasm::Builder::makeConst<int>((Builder *)&local_68,(int)local_40);
        item = (Expression *)MixedArena::allocSpace((MixedArena *)(local_68._0_8_ + 0x200),0x28,8);
        item->_id = ArraySetId;
        (item->type).id = 0;
        *(undefined1 **)(item + 1) = puVar9;
        item[1].type.id = (uintptr_t)local_40;
        *(Expression **)(item + 2) = pEVar13;
        wasm::ArraySet::finalize();
      }
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 (*(long *)(local_48 + 0x100) + 0x20),item);
      local_68._0_8_ = *(undefined8 *)((long)this + 0xd0);
      HVar12 = wasm::Type::getHeapType(&pEVar13->type);
      pEVar13 = (Expression *)wasm::Builder::makeRefNull((Builder *)&local_68,HVar12);
      *child = pEVar13;
      return true;
    }
    __assert_fail("isNullableAndMutable(parent, fieldIndex)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                  ,0x2ec,
                  "bool (anonymous namespace)::CtorEvalExternalInterface::applyGlobalsToModule()::InitFixer::handleChild(Expression *&, Expression *, Index)"
                 );
  }
  return false;
}

Assistant:

bool handleChild(Expression*& child,
                         Expression* parent,
                         Index fieldIndex = 0) {
          if (!child) {
            return false;
          }

          if (auto* get = child->dynCast<GlobalGet>()) {
            if (!readableGlobals.count(get->name)) {
              // This get cannot be read - it is a global that appears after
              // us - and so we must fix it up, using the method mentioned
              // before (setting it to null now, and later in the start
              // function writing to it).
              assert(isNullableAndMutable(parent, fieldIndex));
              evaller.addStartFixup(
                {global->name, global->type}, fieldIndex, get);
              child =
                Builder(*getModule()).makeRefNull(get->type.getHeapType());
              return true;
            }
          }

          return false;
        }